

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QWidget *widget)

{
  QFormLayoutPrivate *this_00;
  bool bVar1;
  int row_00;
  
  this_00 = *(QFormLayoutPrivate **)&(this->super_QLayout).field_0x8;
  bVar1 = QLayoutPrivate::checkWidget(&this_00->super_QLayoutPrivate,widget);
  if (bVar1) {
    row_00 = QFormLayoutPrivate::insertRow(this_00,row);
    QFormLayoutPrivate::setWidget(this_00,row_00,SpanningRole,widget);
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    return;
  }
  return;
}

Assistant:

void QFormLayout::insertRow(int row, QWidget *widget)
{
    Q_D(QFormLayout);
    if (!d->checkWidget(widget))
        return;

    row = d->insertRow(row);
    d->setWidget(row, SpanningRole, widget);
    invalidate();
}